

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacProj.cpp
# Opt level: O0

void __thiscall MacProj::install_level(MacProj *this,int level,AmrLevel *level_data)

{
  int iVar1;
  AmrLevel **ppAVar2;
  pointer __p;
  AmrMesh *this_00;
  BoxArray *ref_ratio;
  DistributionMapping *dm;
  AmrLevel *in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  int lev;
  pointer in_stack_fffffffffffffdd8;
  Print *in_stack_fffffffffffffde0;
  AmrMesh *this_01;
  size_type in_stack_fffffffffffffdf8;
  vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *in_stack_fffffffffffffe00;
  ostream *in_stack_fffffffffffffe08;
  FluxRegister *in_stack_fffffffffffffe10;
  int local_1b4;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffe54;
  
  if (verbose != 0) {
    amrex::OutStream();
    amrex::Print::Print((Print *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    amrex::Print::operator<<(in_stack_fffffffffffffde0,(char (*) [26])in_stack_fffffffffffffdd8);
    in_stack_fffffffffffffe10 =
         (FluxRegister *)
         amrex::Print::operator<<(in_stack_fffffffffffffde0,(int *)in_stack_fffffffffffffdd8);
    uVar3 = CONCAT13(10,(int3)in_stack_fffffffffffffe50);
    amrex::Print::operator<<(in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8);
    amrex::Print::~Print((Print *)CONCAT44(in_stack_fffffffffffffe54,uVar3));
  }
  iVar1 = amrex::AmrMesh::finestLevel((AmrMesh *)*in_RDI);
  if (iVar1 < *(int *)(in_RDI + 0xb)) {
    local_1b4 = amrex::AmrMesh::finestLevel((AmrMesh *)*in_RDI);
    while (local_1b4 = local_1b4 + 1, local_1b4 <= *(int *)(in_RDI + 0xb)) {
      amrex::
      Vector<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
                    *)in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
      std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>::reset
                ((unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_> *)
                 in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    }
  }
  iVar1 = amrex::AmrMesh::finestLevel((AmrMesh *)*in_RDI);
  *(int *)(in_RDI + 0xb) = iVar1;
  if (*(int *)((long)in_RDI + 0x5c) < in_ESI) {
    *(undefined4 *)((long)in_RDI + 0x5c) = *(undefined4 *)(in_RDI + 0xb);
    std::vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::resize
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    std::
    vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::resize((vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
              *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    std::
    vector<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
    ::resize((vector<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
              *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  }
  ppAVar2 = amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                      ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                       in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
  *ppAVar2 = in_RDX;
  if (0 < in_ESI) {
    __p = (pointer)amrex::
                   Vector<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
                   ::operator[]((Vector<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
                                 *)in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
    this_00 = (AmrMesh *)operator_new(0x988);
    iVar1 = (int)((ulong)(in_RDI + 1) >> 0x20);
    this_01 = this_00;
    ppAVar2 = amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                        ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)this_00,
                         (size_type)__p);
    ref_ratio = amrex::AmrLevel::boxArray(*ppAVar2);
    ppAVar2 = amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                        ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)this_00,
                         (size_type)__p);
    dm = amrex::AmrLevel::DistributionMap(*ppAVar2);
    amrex::AmrMesh::refRatio(this_01,iVar1);
    amrex::FluxRegister::FluxRegister
              (in_stack_fffffffffffffe10,(BoxArray *)in_RDX,dm,(IntVect *)ref_ratio,
               (int)((ulong)this_01 >> 0x20),(int)this_01);
    std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>::reset
              ((unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_> *)this_00
               ,__p);
  }
  return;
}

Assistant:

void
MacProj::install_level (int       level,
                        AmrLevel* level_data)
{
    if (verbose) amrex::Print() << "Installing MacProj level " << level << '\n';
    if (parent->finestLevel() < finest_level)
        for (int lev = parent->finestLevel() + 1; lev <= finest_level; lev++)
            mac_reg[lev].reset();

    finest_level = parent->finestLevel();

    if (level > finest_level_allocated)
    {
        finest_level_allocated = finest_level;
        LevelData.resize(finest_level+1);
        mac_phi_crse.resize(finest_level+1);
        mac_reg.resize(finest_level+1);
    }

    LevelData[level] = level_data;

    if (level > 0)
    {
        mac_reg[level].reset(new FluxRegister(LevelData[level]->boxArray(),
                                              LevelData[level]->DistributionMap(),
                                              parent->refRatio(level-1),level,1));
    }

}